

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getpass.c
# Opt level: O2

char * getpass_r(char *prompt,char *password,size_t buflen)

{
  int fd;
  ssize_t sVar1;
  char *pcVar2;
  
  fd = open64("/dev/tty",0);
  if (fd == -1) {
    fd = 0;
  }
  ttyecho(false,fd);
  fputs(prompt,_stderr);
  sVar1 = read(fd,password,buflen);
  pcVar2 = password + sVar1 + -1;
  if (sVar1 < 1) {
    pcVar2 = password;
  }
  *pcVar2 = '\0';
  fputs("\n",_stderr);
  ttyecho(true,fd);
  if (fd != 0) {
    close(fd);
  }
  return password;
}

Assistant:

char *getpass_r(const char *prompt, /* prompt to display */
                char *password,     /* buffer to store password in */
                size_t buflen)      /* size of buffer to store password in */
{
  ssize_t nread;
  bool disabled;
  int fd = open("/dev/tty", O_RDONLY);
  if(-1 == fd)
    fd = STDIN_FILENO; /* use stdin if the tty couldn't be used */

  disabled = ttyecho(FALSE, fd); /* disable terminal echo */

  fputs(prompt, stderr);
  nread = read(fd, password, buflen);
  if(nread > 0)
    password[--nread] = '\0'; /* null-terminate where enter is stored */
  else
    password[0] = '\0'; /* got nothing */

  if(disabled) {
    /* if echo actually was disabled, add a newline */
    fputs("\n", stderr);
    (void)ttyecho(TRUE, fd); /* enable echo */
  }

  if(STDIN_FILENO != fd)
    close(fd);

  return password; /* return pointer to buffer */
}